

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void write_deleted_particles(bool write_p,bool write_ph)

{
  int iVar1;
  size_t __n;
  bool bVar2;
  double dVar3;
  undefined8 uVar4;
  _Ios_Openmode _Var5;
  uint uVar6;
  void *__s;
  long *plVar7;
  long *plVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  long *plVar11;
  ulong uVar12;
  void *pvVar13;
  double *pdVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long *this;
  double dVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string file_name;
  string file_name_suffix;
  char s_cmr [20];
  ofstream fout_deleted_p;
  ofstream fout_deleted_e;
  ofstream fout_deleted_ph;
  undefined1 *local_6d0 [2];
  undefined1 local_6c0 [16];
  char *local_6b0;
  undefined8 local_6a8;
  char local_6a0 [16];
  string local_690;
  __uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_> local_670;
  ios_base *local_668;
  ios_base *local_660;
  ios_base *local_658;
  undefined8 local_650;
  char local_648 [24];
  long *local_630;
  long local_628;
  long local_620;
  long lStack_618;
  ios_base aiStack_538 [264];
  long *local_430;
  long local_428;
  long local_420;
  long lStack_418;
  ios_base local_338 [264];
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  ios_base aiStack_138 [264];
  
  _Var5 = (_S_out|_S_app) - (uint)(mpi_rank == 0);
  local_6b0 = local_6a0;
  local_6a8 = 0;
  local_6a0[0] = '\0';
  OutputIterations::get_current_iteration_string_abi_cxx11_(&local_690,&output_iterations);
  iVar1 = neps_ph;
  __n = (long)neps_ph * 8;
  uVar16 = 0xffffffffffffffff;
  if (-1 < (long)neps_ph) {
    uVar16 = __n;
  }
  __s = operator_new__(uVar16);
  if (0 < iVar1) {
    memset(__s,0,__n);
  }
  plVar11 = _VTT;
  if (0 < n_sr) {
    local_650 = ___throw_bad_array_new_length;
    local_660 = aiStack_138;
    local_668 = aiStack_538;
    local_658 = local_338;
    uVar16 = 0;
    do {
      if (uVar16 == (uint)mpi_rank) {
        local_630 = &local_620;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_630,data_folder_abi_cxx11_._M_dataplus._M_p,
                   data_folder_abi_cxx11_._M_dataplus._M_p + data_folder_abi_cxx11_._M_string_length
                  );
        std::__cxx11::string::append((char *)&local_630);
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_630,(ulong)local_690._M_dataplus._M_p);
        plVar8 = plVar7 + 2;
        if ((long *)*plVar7 == plVar8) {
          local_420 = *plVar8;
          lStack_418 = plVar7[3];
          local_430 = &local_420;
        }
        else {
          local_420 = *plVar8;
          local_430 = (long *)*plVar7;
        }
        local_428 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_6b0,(string *)&local_430);
        if (local_430 != &local_420) {
          operator_delete(local_430);
        }
        if (local_630 != &local_620) {
          operator_delete(local_630);
        }
        std::ofstream::ofstream(&local_430,local_6b0,_Var5);
        local_230 = &local_220;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_230,data_folder_abi_cxx11_._M_dataplus._M_p,
                   data_folder_abi_cxx11_._M_dataplus._M_p + data_folder_abi_cxx11_._M_string_length
                  );
        std::__cxx11::string::append((char *)&local_230);
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_230,(ulong)local_690._M_dataplus._M_p);
        plVar8 = plVar7 + 2;
        if ((long *)*plVar7 == plVar8) {
          local_620 = *plVar8;
          lStack_618 = plVar7[3];
          local_630 = &local_620;
        }
        else {
          local_620 = *plVar8;
          local_630 = (long *)*plVar7;
        }
        local_628 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_6b0,(string *)&local_630);
        if (local_630 != &local_620) {
          operator_delete(local_630);
        }
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        std::ofstream::ofstream(&local_630,local_6b0,_Var5);
        local_6d0[0] = local_6c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_6d0,data_folder_abi_cxx11_._M_dataplus._M_p,
                   data_folder_abi_cxx11_._M_dataplus._M_p + data_folder_abi_cxx11_._M_string_length
                  );
        std::__cxx11::string::append((char *)local_6d0);
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_6d0,(ulong)local_690._M_dataplus._M_p);
        plVar8 = plVar7 + 2;
        if ((long *)*plVar7 == plVar8) {
          local_220 = *plVar8;
          lStack_218 = plVar7[3];
          local_230 = &local_220;
        }
        else {
          local_220 = *plVar8;
          local_230 = (long *)*plVar7;
        }
        local_228 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_6b0,(string *)&local_230);
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        if (local_6d0[0] != local_6c0) {
          operator_delete(local_6d0[0]);
        }
        std::ofstream::ofstream((string *)&local_230,local_6b0,_Var5);
        iVar1 = n_ion_populations;
        lVar17 = (long)n_ion_populations;
        uVar12 = lVar17 * 0x200 + 8;
        if (lVar17 < 0) {
          uVar12 = 0xffffffffffffffff;
        }
        plVar8 = (long *)operator_new__(uVar12);
        *plVar8 = lVar17;
        plVar7 = plVar8 + 1;
        if (iVar1 != 0) {
          lVar15 = 0;
          this = plVar7;
          do {
            std::ofstream::ofstream(this);
            lVar15 = lVar15 + -0x200;
            this = this + 0x40;
          } while (-lVar15 != lVar17 * 0x200);
        }
        if (0 < n_ion_populations) {
          lVar17 = 0;
          do {
            sprintf(local_648,"%g",icmr[lVar17]);
            local_6d0[0] = local_6c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_6d0,data_folder_abi_cxx11_._M_dataplus._M_p,
                       data_folder_abi_cxx11_._M_dataplus._M_p +
                       data_folder_abi_cxx11_._M_string_length);
            std::__cxx11::string::append((char *)local_6d0);
            std::__cxx11::string::operator=((string *)&local_6b0,(string *)local_6d0);
            if (local_6d0[0] != local_6c0) {
              operator_delete(local_6d0[0]);
            }
            std::__cxx11::string::append((char *)&local_6b0);
            std::__cxx11::string::append((char *)&local_6b0);
            std::__cxx11::string::_M_append((char *)&local_6b0,(ulong)local_690._M_dataplus._M_p);
            std::ofstream::open((char *)plVar7,(_Ios_Openmode)local_6b0);
            lVar17 = lVar17 + 1;
            plVar7 = plVar7 + 0x40;
          } while (lVar17 < n_ion_populations);
        }
        pdVar14 = *(double **)
                   ((long)psr._M_t.
                          super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                          .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x248);
        local_670._M_t.
        super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
        super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
             (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
             (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
             psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
             _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
             super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl;
        for (; pdVar14 !=
               *(double **)
                ((long)local_670._M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x250);
            pdVar14 = pdVar14 + 10) {
          dVar18 = *pdVar14;
          if ((dVar18 != -1.0) || (NAN(dVar18))) {
            if (dVar18 == 1.0 && write_p) {
              iVar1 = i_particle_p + 1;
              bVar2 = enthp_p <= i_particle_p;
              i_particle_p = iVar1;
              if (bVar2) {
                i_particle_ph = 0;
                poVar9 = std::ostream::_M_insert<double>(pdVar14[1]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>
                                   ((((double)x0_sr.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_start[uVar16] +
                                     pdVar14[2]) * dx) / 6.283185307179586);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>((dy * pdVar14[3]) / 6.283185307179586);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>((dz * pdVar14[4]) / 6.283185307179586);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>(pdVar14[5]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>(pdVar14[6]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>(pdVar14[7]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>(pdVar14[8]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>(pdVar14[9]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                goto LAB_00116f74;
              }
            }
            else if (write_ph && dVar18 == 0.0) {
              uVar6 = (uint)((pdVar14[8] * 0.511) / deps_ph);
              if ((-1 < (int)uVar6) && ((int)uVar6 < neps_ph)) {
                *(double *)((long)__s + (ulong)uVar6 * 8) =
                     *(double *)((long)__s + (ulong)uVar6 * 8) + pdVar14[1];
              }
              bVar2 = enthp_ph <= i_particle_ph;
              i_particle_ph = i_particle_ph + 1;
              if (bVar2) {
                i_particle_ph = 0;
                poVar9 = std::ostream::_M_insert<double>(pdVar14[1]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>
                                   ((((double)x0_sr.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_start[uVar16] +
                                     pdVar14[2]) * dx) / 6.283185307179586);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>((dy * pdVar14[3]) / 6.283185307179586);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>((dz * pdVar14[4]) / 6.283185307179586);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>(pdVar14[5]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>(pdVar14[6]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>(pdVar14[7]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>(pdVar14[8]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = std::ostream::_M_insert<double>(pdVar14[9]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                goto LAB_00116f74;
              }
            }
            else if (0 < (long)n_ion_populations) {
              lVar17 = 0;
              do {
                if ((dVar18 == icmr[lVar17]) && (!NAN(dVar18) && !NAN(icmr[lVar17]))) {
                  bVar2 = enthp_i <= i_particle_i;
                  i_particle_i = i_particle_i + 1;
                  if (bVar2) {
                    i_particle_i = 0;
                    poVar9 = std::ostream::_M_insert<double>(pdVar14[1]);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    poVar9 = std::ostream::_M_insert<double>
                                       ((((double)x0_sr.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar16] +
                                         pdVar14[2]) * dx) / 6.283185307179586);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    poVar9 = std::ostream::_M_insert<double>((dy * pdVar14[3]) / 6.283185307179586);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    poVar9 = std::ostream::_M_insert<double>((dz * pdVar14[4]) / 6.283185307179586);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    poVar9 = std::ostream::_M_insert<double>(pdVar14[5]);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    poVar9 = std::ostream::_M_insert<double>(pdVar14[6]);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    poVar9 = std::ostream::_M_insert<double>(pdVar14[7]);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    poVar9 = std::ostream::_M_insert<double>(pdVar14[8]);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    poVar9 = std::ostream::_M_insert<double>(pdVar14[9]);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                  }
                  break;
                }
                lVar17 = lVar17 + 1;
              } while (n_ion_populations != lVar17);
            }
          }
          else {
            bVar2 = enthp <= i_particle;
            i_particle = i_particle + 1;
            if (bVar2) {
              i_particle = 0;
              poVar9 = std::ostream::_M_insert<double>(pdVar14[1]);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              poVar9 = std::ostream::_M_insert<double>
                                 ((((double)x0_sr.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start[uVar16] +
                                   pdVar14[2]) * dx) / 6.283185307179586);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              poVar9 = std::ostream::_M_insert<double>((dy * pdVar14[3]) / 6.283185307179586);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              poVar9 = std::ostream::_M_insert<double>((dz * pdVar14[4]) / 6.283185307179586);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              poVar9 = std::ostream::_M_insert<double>(pdVar14[5]);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              poVar9 = std::ostream::_M_insert<double>(pdVar14[6]);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              poVar9 = std::ostream::_M_insert<double>(pdVar14[7]);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              poVar9 = std::ostream::_M_insert<double>(pdVar14[8]);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              poVar9 = std::ostream::_M_insert<double>(pdVar14[9]);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
LAB_00116f74:
              std::ostream::put((char)poVar9);
              std::ostream::flush();
            }
          }
        }
        if (*(double **)
             ((long)local_670._M_t.
                    super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                    super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x250) !=
            *(double **)
             ((long)local_670._M_t.
                    super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                    super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x248)) {
          *(double **)
           ((long)local_670._M_t.
                  super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                  super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x250) =
               *(double **)
                ((long)local_670._M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x248);
        }
        std::ofstream::close();
        std::ofstream::close();
        std::ofstream::close();
        if (0 < n_ion_populations) {
          lVar17 = 0;
          do {
            std::ofstream::close();
            lVar17 = lVar17 + 1;
          } while (lVar17 < n_ion_populations);
        }
        uVar4 = local_650;
        lVar17 = *plVar8;
        if (lVar17 != 0) {
          plVar7 = plVar8 + lVar17 * 0x40 + -0x3f;
          lVar17 = lVar17 * -0x200;
          do {
            *plVar7 = (long)plVar11;
            *(undefined8 *)((long)plVar7 + plVar11[-3]) = uVar4;
            std::filebuf::~filebuf((filebuf *)(plVar7 + 1));
            std::ios_base::~ios_base((ios_base *)(plVar7 + 0x1f));
            plVar7 = plVar7 + -0x40;
            lVar17 = lVar17 + 0x200;
          } while (lVar17 != 0);
        }
        operator_delete__(plVar8);
        local_230 = plVar11;
        *(undefined8 *)((long)&local_230 + plVar11[-3]) = uVar4;
        std::filebuf::~filebuf((filebuf *)&local_228);
        std::ios_base::~ios_base(local_660);
        local_630 = plVar11;
        *(undefined8 *)((long)&local_630 + plVar11[-3]) = uVar4;
        std::filebuf::~filebuf((filebuf *)&local_628);
        std::ios_base::~ios_base(local_668);
        local_430 = plVar11;
        *(undefined8 *)((long)&local_430 + plVar11[-3]) = uVar4;
        std::filebuf::~filebuf((filebuf *)&local_428);
        std::ios_base::~ios_base(local_658);
      }
      MPI_Barrier(&ompi_mpi_comm_world);
      uVar16 = uVar16 + 1;
    } while ((long)uVar16 < (long)n_sr);
  }
  if (write_ph) {
    pvVar13 = __s;
    if (mpi_rank == 0) {
      pvVar13 = (void *)0x1;
    }
    MPI_Reduce(pvVar13,__s,neps_ph,&ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
    if (mpi_rank == 0) {
      local_630 = &local_620;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_630,data_folder_abi_cxx11_._M_dataplus._M_p,
                 data_folder_abi_cxx11_._M_dataplus._M_p + data_folder_abi_cxx11_._M_string_length);
      std::__cxx11::string::append((char *)&local_630);
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_630,(ulong)local_690._M_dataplus._M_p);
      plVar11 = puVar10 + 2;
      if ((long *)*puVar10 == plVar11) {
        local_420 = *plVar11;
        lStack_418 = puVar10[3];
        local_430 = &local_420;
      }
      else {
        local_420 = *plVar11;
        local_430 = (long *)*puVar10;
      }
      local_428 = puVar10[1];
      *puVar10 = plVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_6b0,(string *)&local_430);
      if (local_430 != &local_420) {
        operator_delete(local_430);
      }
      if (local_630 != &local_620) {
        operator_delete(local_630);
      }
      std::ofstream::ofstream(&local_430,local_6b0,_S_out);
      if (0 < neps_ph) {
        dVar18 = ((lambda * 11148500000000.0 * dx * dy * dz) / 248.05021344239853) / deps_ph;
        lVar17 = 0;
        do {
          dVar3 = dVar18 * *(double *)((long)__s + lVar17 * 8);
          *(double *)((long)__s + lVar17 * 8) = dVar3;
          poVar9 = std::ostream::_M_insert<double>(dVar3);
          local_630 = (long *)CONCAT71(local_630._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_630,1);
          lVar17 = lVar17 + 1;
        } while (lVar17 < neps_ph);
      }
      std::ofstream::close();
      local_430 = _VTT;
      *(undefined8 *)((long)&local_430 + _VTT[-3]) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)&local_428);
      std::ios_base::~ios_base(local_338);
    }
  }
  operator_delete__(__s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p);
  }
  if (local_6b0 != local_6a0) {
    operator_delete(local_6b0);
  }
  return;
}

Assistant:

void write_deleted_particles(bool write_p, bool write_ph)
{
    ios_base::openmode non_binary_mode;
    if (mpi_rank == 0) {
        non_binary_mode = ios_base::out;
    } else {
        non_binary_mode = ios_base::out | ios_base::app;
    }

    std::string file_name;
    std::string file_name_suffix = output_iterations.get_current_iteration_string();
    
    double* spectrum_ph = new double[neps_ph];
    for(int i=0; i<neps_ph; i++) spectrum_ph[i] = 0;
    int i_eps = 0;

    for(int n=0; n<n_sr; n++)
    {
        if (mpi_rank == n) {
            file_name = data_folder + "/deleted" + file_name_suffix;
            ofstream fout_deleted_e(file_name.c_str(), non_binary_mode);

            file_name = data_folder + "/deleted_p" + file_name_suffix;
            ofstream fout_deleted_p(file_name.c_str(), non_binary_mode);

            file_name = data_folder + "/deleted_ph" + file_name_suffix;
            ofstream fout_deleted_ph(file_name.c_str(), non_binary_mode);

            ofstream* fout_deleted_i = new ofstream[n_ion_populations];
            for (int m=0; m<n_ion_populations; ++m)
            {
                char s_cmr[20];
                sprintf(s_cmr,"%g",icmr[m]);
                file_name = data_folder+"/deleted_";
                file_name += s_cmr;
                file_name += "_";
                file_name += file_name_suffix;
                fout_deleted_i[m].open(file_name.c_str(), non_binary_mode);
            }

            vector<spatial_region::deleted_particle>& del_particles = psr->deleted_particles;

            for (auto it = del_particles.begin(); it != del_particles.end(); ++it)
            {
                if ((*it).cmr == -1)
                {
                    i_particle++;
                    if(i_particle > enthp)
                    {
                        i_particle = 0;
                        fout_deleted_e << (*it).q << endl;
                        fout_deleted_e << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                        fout_deleted_e << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                        fout_deleted_e << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                        #ifdef QUILL_NOQED
                        fout_deleted_e << (*it).g << endl << 0.0 << endl;
                        #else
                        fout_deleted_e << (*it).g << endl << (*it).chi << endl;
                        #endif
                    }
                }
                else if (write_p && (*it).cmr == 1)
                {
                    i_particle_p++;
                    if(i_particle_p > enthp_p)
                    {
                        i_particle_ph = 0;
                        fout_deleted_p << (*it).q << endl;
                        fout_deleted_p << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                        fout_deleted_p << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                        fout_deleted_p << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                        #ifdef QUILL_NOQED
                        fout_deleted_p << (*it).g << endl << 0.0 << endl;
                        #else
                        fout_deleted_p << (*it).g << endl << (*it).chi << endl;
                        #endif
                    }
                }
                else if (write_ph && (*it).cmr == 0)
                {
                    i_eps = (*it).g*0.511/deps_ph;
                    if((i_eps > -1) && (i_eps < neps_ph)) {
                        spectrum_ph[i_eps] = spectrum_ph[i_eps] + (*it).q; // q>0 for photons
                    }
                    i_particle_ph++;
                    if(i_particle_ph > enthp_ph)
                    {
                        i_particle_ph = 0;
                        fout_deleted_ph << (*it).q << endl;
                        fout_deleted_ph << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                        fout_deleted_ph << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                        fout_deleted_ph << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                        #ifdef QUILL_NOQED
                        fout_deleted_ph << (*it).g << endl << 0.0 << endl;
                        #else
                        fout_deleted_ph << (*it).g << endl << (*it).chi << endl;
                        #endif
                    }
                }
                else
                {
                    for (int j=0; j<n_ion_populations; ++j)
                    {
                        if ((*it).cmr == icmr[j])
                        {
                            i_particle_i++;
                            if(i_particle_i > enthp_i)
                            {
                                i_particle_i = 0;
                                fout_deleted_i[j] << (*it).q << endl;
                                fout_deleted_i[j] << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                                fout_deleted_i[j] << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                                fout_deleted_i[j] << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                                #ifdef QUILL_NOQED
                                fout_deleted_i[j] << (*it).g << endl << 0.0 << endl;
                                #else
                                fout_deleted_i[j] << (*it).g << endl << (*it).chi << endl;
                                #endif
                            }
                            break;
                        }
                    }
                }
            }
            del_particles.clear();
            fout_deleted_e.close();
            fout_deleted_p.close();
            fout_deleted_ph.close();
            for (int m=0; m<n_ion_populations; ++m)
            {
                fout_deleted_i[m].close();
            }
            delete[] fout_deleted_i;
        }
        MPI_Barrier(MPI_COMM_WORLD);
    }

    if (write_ph) {
        //gathering photon spectra on process rank 0
        if (mpi_rank == 0) {
            MPI_Reduce(MPI_IN_PLACE, spectrum_ph, neps_ph, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
        } else {
            MPI_Reduce(spectrum_ph, spectrum_ph, neps_ph, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
        }

        //spectrum output
        if (mpi_rank == 0) {
            file_name = data_folder + "/spectrum_deleted_ph" + file_name_suffix;
            ofstream fout_spectrum_ph(file_name.c_str());

            double spectrum_norm_ph = 1.11485e13 * lambda*dx*dy*dz/(8*PI*PI*PI)/deps_ph;
            for(int i=0; i<neps_ph; i++)
            {
                spectrum_ph[i] = spectrum_ph[i] * spectrum_norm_ph;
                fout_spectrum_ph << spectrum_ph[i] << '\n';
            }

            fout_spectrum_ph.close();
        }
    }

    delete[] spectrum_ph;
}